

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
          (JavascriptPromiseCapability *this,SnapPromiseCapabilityInfo *snapPromiseCapability,
          List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *depOnList,SlabAllocator *alloc)

{
  SlabAllocator *pSVar1;
  bool bVar2;
  JavascriptPromiseCapability **ppJVar3;
  void **ppvVar4;
  void *local_48;
  void *local_40;
  void *local_38;
  JavascriptPromiseCapability *local_30;
  SlabAllocator *local_28;
  SlabAllocator *alloc_local;
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *depOnList_local;
  SnapPromiseCapabilityInfo *snapPromiseCapability_local;
  JavascriptPromiseCapability *this_local;
  
  local_30 = this;
  local_28 = alloc;
  alloc_local = (SlabAllocator *)depOnList;
  depOnList_local =
       (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       snapPromiseCapability;
  snapPromiseCapability_local = (SnapPromiseCapabilityInfo *)this;
  ppJVar3 = Memory::PointerValue<Js::JavascriptPromiseCapability>(&local_30);
  (depOnList_local->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)*ppJVar3;
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->promise);
  (depOnList_local->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
  buffer = (Type)*ppvVar4;
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->promise);
  bVar2 = TTD::JsSupport::IsVarComplexKind(*ppvVar4);
  pSVar1 = alloc_local;
  if (bVar2) {
    ppvVar4 = Memory::PointerValue<void>(&this->resolve);
    local_38 = *ppvVar4;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)pSVar1,(unsigned_long *)&local_38);
  }
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->resolve);
  *(void **)&(depOnList_local->
             super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
       *ppvVar4;
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->resolve);
  bVar2 = TTD::JsSupport::IsVarComplexKind(*ppvVar4);
  pSVar1 = alloc_local;
  if (bVar2) {
    ppvVar4 = Memory::PointerValue<void>(&this->resolve);
    local_40 = *ppvVar4;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)pSVar1,(unsigned_long *)&local_40);
  }
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject);
  (depOnList_local->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).alloc
       = (Type)*ppvVar4;
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject);
  bVar2 = TTD::JsSupport::IsVarComplexKind(*ppvVar4);
  pSVar1 = alloc_local;
  if (bVar2) {
    ppvVar4 = Memory::PointerValue<void>(&this->reject);
    local_48 = *ppvVar4;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)pSVar1,(unsigned_long *)&local_48);
  }
  return;
}

Assistant:

void JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto(TTD::NSSnapValues::SnapPromiseCapabilityInfo* snapPromiseCapability, JsUtil::List<TTD_PTR_ID, HeapAllocator>& depOnList, TTD::SlabAllocator& alloc)
    {
        snapPromiseCapability->CapabilityId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this);

        snapPromiseCapability->PromiseVar = this->promise;
        if(TTD::JsSupport::IsVarComplexKind(this->promise))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->ResolveVar = this->resolve;
        if(TTD::JsSupport::IsVarComplexKind(this->resolve))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->RejectVar = this->reject;
        if(TTD::JsSupport::IsVarComplexKind(this->reject))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->reject));
        }
    }